

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FeatureSetDefaults::ByteSizeLong(FeatureSetDefaults *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  anon_union_40_1_493b367e_for_FeatureSetDefaults_3 aVar4;
  uint uVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  size_t sVar9;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar10;
  
  sVar9 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.defaults_;
  pRVar10 = this_00;
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
              pRVar6->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                pRVar6->elements;
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar10 !=
         (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = FeatureSetDefaults_FeatureSetEditionDefault::ByteSizeLong
                      ((FeatureSetDefaults_FeatureSetEditionDefault *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar7 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar9 = sVar9 + sVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  aVar4 = this->field_0;
  if (((undefined1  [40])aVar4 & (undefined1  [40])0x3) != (undefined1  [40])0x0) {
    if (((undefined1  [40])aVar4 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      uVar8 = (long)(this->field_0)._impl_.minimum_edition_ | 1;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar9 = sVar9 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [40])aVar4 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      uVar8 = (long)(this->field_0)._impl_.maximum_edition_ | 1;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar9 = sVar9 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar9 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar9,&(this->field_0)._impl_._cached_size_);
  return sVar9;
}

Assistant:

::size_t FeatureSetDefaults::ByteSizeLong() const {
  const FeatureSetDefaults& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FeatureSetDefaults)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault defaults = 1;
    {
      total_size += 1UL * this_._internal_defaults_size();
      for (const auto& msg : this_._internal_defaults()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.Edition minimum_edition = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_minimum_edition());
    }
    // optional .google.protobuf.Edition maximum_edition = 5;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_maximum_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}